

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O3

void pbrt::
     LogFatal<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [64],char (*args_1) [6],
               char (*args_2) [64],float *args_3,char (*args_4) [6],double *args_5)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
            (&local_40,fmt,args,args_1,args_2,args_3,args_4,args_5);
  LogFatal(level,file,line,local_40._M_dataplus._M_p);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}